

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseDeclarationOrFunctionDefinition_AtDeclarator
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax *specList)

{
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar1;
  DeclarationSyntax **decl_00;
  SpecifierListSyntax *specList_00;
  bool bVar2;
  SyntaxKind SVar3;
  SyntaxKind SVar4;
  int iVar5;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar6;
  SyntaxToken *pSVar7;
  SyntaxNode *pSVar8;
  long lVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IndexType IVar10;
  VariableAndOrFunctionDeclarationSyntax *pVVar11;
  ostream *poVar12;
  undefined1 *puVar13;
  InitializerSyntax **init;
  DeclaratorListSyntax *decltorList;
  ExtKR_ParameterDeclarationListSyntax *paramKRList;
  Backtracker BT;
  undefined1 auStack_c8 [8];
  DeclaratorSyntax *local_c0;
  DeclaratorListSyntax *local_b8;
  DeclarationSyntax **local_b0;
  SpecifierListSyntax *local_a8;
  ExtKR_ParameterDeclarationListSyntax *local_a0;
  Backtracker local_98;
  undefined4 extraout_var;
  
  puVar13 = auStack_c8;
  local_b8 = (DeclaratorListSyntax *)0x0;
  local_c0 = (DeclaratorSyntax *)0x0;
  bVar2 = parseDeclarator(this,&local_c0,Unspecified,Concrete);
  if (!bVar2) {
    return false;
  }
  local_b0 = decl;
  local_a8 = specList;
  do {
    pSVar6 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                       (this,&local_c0);
    *(SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> **)(puVar13 + 0x10) = pSVar6;
    pSVar7 = peek(this,1);
    SVar4 = pSVar7->syntaxK_;
    if (SVar4 == EqualsToken) {
      pSVar8 = &SyntaxUtilities::unparenthesizeDeclarator(local_c0)->super_SyntaxNode;
      SVar3 = SyntaxNode::kind(pSVar8);
      switch(SVar3) {
      case PointerDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x4e])(pSVar8);
        lVar9 = CONCAT44(extraout_var,iVar5);
        break;
      case IdentifierDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x50])(pSVar8);
        IVar10 = consume(this);
        *(IndexType *)(CONCAT44(extraout_var_00,iVar5) + 0x30) = IVar10;
        init = (InitializerSyntax **)(CONCAT44(extraout_var_00,iVar5) + 0x38);
        goto LAB_002b56d1;
      default:
switchD_002b5645_caseD_413:
        DiagnosticsReporter::UnexpectedInitializerOfDeclarator(&this->diagReporter_);
        bVar2 = ignoreDeclarator(this);
        return bVar2;
      case ArrayDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x56])(pSVar8);
        lVar9 = CONCAT44(extraout_var_02,iVar5);
        break;
      case FunctionDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x56])(pSVar8);
        lVar9 = CONCAT44(extraout_var_01,iVar5);
        if (*(DeclaratorSyntax **)(lVar9 + 0x20) == (DeclaratorSyntax *)0x0)
        goto switchD_002b5645_caseD_413;
        pSVar8 = &SyntaxUtilities::unparenthesizeDeclarator(*(DeclaratorSyntax **)(lVar9 + 0x20))->
                  super_SyntaxNode;
        SVar3 = SyntaxNode::kind(pSVar8);
        if (SVar3 != PointerDeclarator) goto switchD_002b5645_caseD_413;
      }
      IVar10 = consume(this);
      *(IndexType *)(lVar9 + 0x38) = IVar10;
      init = (InitializerSyntax **)(lVar9 + 0x40);
LAB_002b56d1:
      bVar2 = parseInitializer(this,init);
      if (!bVar2) {
        return false;
      }
    }
    pSVar7 = peek(this,1);
    specList_00 = local_a8;
    decl_00 = local_b0;
    SVar3 = pSVar7->syntaxK_;
    if (SVar3 != CommaToken) {
      if (SVar3 == OpenBraceToken) {
        bVar2 = parseFunctionDefinition_AtOpenBrace
                          (this,local_b0,local_a8,&local_c0,
                           (ExtKR_ParameterDeclarationListSyntax *)0x0);
        if (bVar2) {
          return true;
        }
      }
      else {
        pSVar1 = local_a8;
        if (SVar3 == SemicolonToken) break;
      }
      if (SVar4 == EqualsToken) {
        DiagnosticsReporter::ExpectedFollowOfDeclaratorAndInitializer(&this->diagReporter_);
        return false;
      }
      Backtracker::Backtracker(&local_98,this,0);
      local_a0 = (ExtKR_ParameterDeclarationListSyntax *)0x0;
      bVar2 = parseExtKR_ParameterDeclarationList(this,&local_a0);
      if (bVar2) {
        Backtracker::discard(&local_98);
        bVar2 = parseFunctionDefinition_AtOpenBrace(this,decl_00,specList_00,&local_c0,local_a0);
        if (bVar2) {
          std::
          vector<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
          ::_M_erase_at_end(&(this->diagReporter_).delayedDiags_,
                            (this->diagReporter_).delayedDiags_.
                            super__Vector_base<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          bVar2 = true;
          goto LAB_002b585e;
        }
      }
      else {
        Backtracker::backtrack(&local_98);
        DiagnosticsReporter::ExpectedFollowOfDeclarator(&this->diagReporter_);
      }
      bVar2 = false;
LAB_002b585e:
      Backtracker::~Backtracker(&local_98);
      return bVar2;
    }
    IVar10 = consume(this);
    puVar13 = *(undefined1 **)(puVar13 + 0x10);
    *(int *)(puVar13 + 0x28) = (int)IVar10;
    local_c0 = (DeclaratorSyntax *)0x0;
    bVar2 = parseDeclarator(this,&local_c0,Unspecified,Concrete);
    if (!bVar2) {
      return false;
    }
  } while( true );
joined_r0x002b574c:
  if (pSVar1 == (SpecifierListSyntax *)0x0) {
    pVVar11 = makeNode<psy::C::VariableAndOrFunctionDeclarationSyntax>(this);
LAB_002b591c:
    *decl_00 = (DeclarationSyntax *)pVVar11;
    IVar10 = consume(this);
    pVVar11->semicolonTkIdx_ = IVar10;
    pVVar11->specs_ = specList_00;
    pVVar11->decltors_ = local_b8;
    return true;
  }
  pSVar8 = *(SyntaxNode **)
            &((CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               *)((long)pSVar1 + 8))->
             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  ;
  if (pSVar8 == (SyntaxNode *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x143);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    return false;
  }
  SVar4 = SyntaxNode::kind(pSVar8);
  if (SVar4 == TypedefStorageClass) {
    pVVar11 = (VariableAndOrFunctionDeclarationSyntax *)
              makeNode<psy::C::TypedefDeclarationSyntax>(this);
    goto LAB_002b591c;
  }
  pSVar1 = *(SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **)
            &((CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               *)((long)pSVar1 + 0x10))->
             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  ;
  goto joined_r0x002b574c;
}

Assistant:

bool Parser::parseDeclarationOrFunctionDefinition_AtDeclarator(
        DeclarationSyntax*& decl,
        const SpecifierListSyntax* specList)
{
    DeclaratorListSyntax* decltorList = nullptr;
    DeclaratorListSyntax** decltorList_cur = &decltorList;

    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Unspecified))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);

        InitializerSyntax** init = nullptr;
        if (peek().kind() == SyntaxKind::EqualsToken) {
            DeclaratorSyntax* unparenDecltor = const_cast<DeclaratorSyntax*>(
                    SyntaxUtilities::unparenthesizeDeclarator(decltor));
            switch (unparenDecltor->kind()) {
                case SyntaxKind::IdentifierDeclarator: {
                    auto identDecltor = unparenDecltor->asIdentifierDeclarator();
                    identDecltor->equalsTkIdx_ = consume();
                    init = &identDecltor->init_;
                    break;
                }

                case SyntaxKind::PointerDeclarator: {
                    auto ptrDecltor = unparenDecltor->asPointerDeclarator();
                    ptrDecltor->equalsTkIdx_ = consume();
                    init = &ptrDecltor->init_;
                    break;
                }

                case SyntaxKind::ArrayDeclarator: {
                    auto arrDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    arrDecltor->equalsTkIdx_ = consume();
                    init = &arrDecltor->init_;
                    break;
                }

                case SyntaxKind::FunctionDeclarator: {
                    auto funcDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    if (funcDecltor->innerDecltor_) {
                        auto unparenInnerDecltor = const_cast<DeclaratorSyntax*>(
                                    SyntaxUtilities::unparenthesizeDeclarator(funcDecltor->innerDecltor_));
                        if (unparenInnerDecltor->kind() == SyntaxKind::PointerDeclarator) {
                            funcDecltor->equalsTkIdx_ = consume();
                            init = &funcDecltor->init_;
                            break;
                        }
                    }
                    [[fallthrough]];
                }

                default:
                    diagReporter_.UnexpectedInitializerOfDeclarator();
                    return ignoreDeclarator();
            }
            if (!parseInitializer(*init))
                return false;
        }

        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                break;

            case SyntaxKind::SemicolonToken: {
                for (auto iter = specList; iter; iter = iter->next) {
                    PSY_ASSERT_2(iter->value, return false);
                    if (iter->value->kind() == SyntaxKind::TypedefStorageClass) {
                        auto tydefDecl = makeNode<TypedefDeclarationSyntax>();
                        decl = tydefDecl;
                        tydefDecl->semicolonTkIdx_ = consume();
                        tydefDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                        tydefDecl->decltors_ = decltorList;
                        return true;
                    }
                }

                auto varAndOrFuncDecl = makeNode<VariableAndOrFunctionDeclarationSyntax>();
                decl = varAndOrFuncDecl;
                varAndOrFuncDecl->semicolonTkIdx_ = consume();
                varAndOrFuncDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                varAndOrFuncDecl->decltors_ = decltorList;
                return true;
            }

            case SyntaxKind::OpenBraceToken:
                if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, nullptr))
                    return true;
                [[fallthrough]];

            default: {
                if (init) {
                    diagReporter_.ExpectedFollowOfDeclaratorAndInitializer();
                    return false;
                }

                Backtracker BT(this);
                ExtKR_ParameterDeclarationListSyntax* paramKRList = nullptr;
                if (parseExtKR_ParameterDeclarationList(paramKRList)) {
                    BT.discard();
                    if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, paramKRList)) {
                        diagReporter_.delayedDiags_.clear();
                        return true;
                    }
                    return false;
                }
                BT.backtrack();

                diagReporter_.ExpectedFollowOfDeclarator();
                return false;
            }
        }

        decltorList_cur = &(*decltorList_cur)->next;
    }
}